

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_setStreamDecode(LZ4_streamDecode_t *LZ4_streamDecode,char *dictionary,int dictSize)

{
  LZ4_streamDecode_t_internal *lz4sd;
  int dictSize_local;
  char *dictionary_local;
  LZ4_streamDecode_t *LZ4_streamDecode_local;
  
  LZ4_streamDecode->table[3] = (long)dictSize;
  LZ4_streamDecode->table[2] = (unsigned_long_long)(dictionary + dictSize);
  LZ4_streamDecode->table[0] = 0;
  LZ4_streamDecode->table[1] = 0;
  return 1;
}

Assistant:

int LZ4_setStreamDecode (LZ4_streamDecode_t* LZ4_streamDecode, const char* dictionary, int dictSize)
{
    LZ4_streamDecode_t_internal* lz4sd = (LZ4_streamDecode_t_internal*) LZ4_streamDecode;
    lz4sd->prefixSize = (size_t) dictSize;
    lz4sd->prefixEnd = (const BYTE*) dictionary + dictSize;
    lz4sd->externalDict = NULL;
    lz4sd->extDictSize  = 0;
    return 1;
}